

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  bigint *this_00;
  buffer<unsigned_int> *in_RSI;
  long in_RDI;
  size_t n;
  size_t j;
  int i;
  bigit borrow;
  bool local_31;
  bigint *in_stack_ffffffffffffffd0;
  bigint *in_stack_ffffffffffffffd8;
  bigint *index;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_12;
  bool local_11;
  buffer<unsigned_int> *local_10;
  
  local_11 = *(int *)(in_RDI + 0xa0) <= *(int *)&in_RSI[5].ptr_;
  local_10 = in_RSI;
  ignore_unused<bool,char[18]>(&local_11,(char (*) [18])"unaligned bigints");
  iVar1 = compare(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  local_12 = -1 < iVar1;
  ignore_unused<bool,char[1]>(&local_12,(char (*) [1])0x833d3c);
  iVar1 = *(int *)&local_10[5].ptr_ - *(int *)(in_RDI + 0xa0);
  index = (bigint *)0x0;
  this_00 = (bigint *)buffer<unsigned_int>::size(local_10);
  for (; index != this_00;
      index = (bigint *)((long)&(index->bigits_).super_buffer<unsigned_int>.ptr_ + 1)) {
    buffer<unsigned_int>::operator[]<unsigned_long>(local_10,(unsigned_long)index);
    subtract_bigits((bigint *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),(int)((ulong)index >> 0x20),
                    (bigit)index,(bigit *)this_00);
    iVar1 = iVar1 + 1;
  }
  local_31 = true;
  ignore_unused<bool,char[1]>(&local_31,(char (*) [1])0x833d3c);
  remove_leading_zeros(this_00);
  return;
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }